

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  char cVar1;
  xpath_value_type xVar2;
  type_t tVar3;
  xpath_node *begin_;
  xpath_node *end_;
  unspecified_bool_type p_Var4;
  unspecified_bool_type p_Var5;
  xpath_node_set *this_00;
  const_iterator begin__00;
  const_iterator end__00;
  nodeset_eval_t eval_00;
  xpath_node_set_raw *set;
  xpath_node_set *s;
  xml_node local_e0;
  xpath_node local_d8;
  xml_attribute local_c8;
  xml_node local_c0;
  xml_node local_b8;
  xpath_node local_b0;
  xml_node local_a0 [2];
  undefined1 local_89;
  undefined1 local_88 [7];
  bool once;
  xpath_node_set_raw rs;
  undefined1 local_58 [8];
  xpath_stack swapped_stack;
  xpath_allocator_capture cr;
  nodeset_eval_t eval_local;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  switch(this->_type) {
  case '\x0f':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack.temp,stack->temp);
    local_58 = (undefined1  [8])stack->temp;
    swapped_stack.result = stack->result;
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval);
    eval_node_set((xpath_node_set_raw *)local_88,this->_right,c,(xpath_stack *)local_58,eval);
    xpath_node_set_raw::set_type(__return_storage_ptr__,type_unsorted);
    begin_ = xpath_node_set_raw::begin((xpath_node_set_raw *)local_88);
    end_ = xpath_node_set_raw::end((xpath_node_set_raw *)local_88);
    xpath_node_set_raw::append(__return_storage_ptr__,begin_,end_,stack->result);
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    xpath_allocator_capture::~xpath_allocator_capture
              ((xpath_allocator_capture *)&swapped_stack.temp);
    break;
  default:
switchD_0024b4a1_caseD_10:
    __assert_fail("false && \"Wrong expression for return type node set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x2aa3,
                  "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                 );
  case '\x11':
    eval_00 = nodeset_eval_all;
    if (this->_test == '\x03') {
      eval_00 = nodeset_eval_first;
    }
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval_00);
    if (this->_test != '\x01') {
      xpath_node_set_raw::sort_do(__return_storage_ptr__);
    }
    tVar3 = xpath_node_set_raw::type(__return_storage_ptr__);
    local_89 = eval_once(tVar3,eval);
    apply_predicate(this,__return_storage_ptr__,0,stack,(bool)local_89);
    break;
  case '\x14':
    cVar1 = this->_rettype;
    xVar2 = xpath_variable::type((this->_data).variable);
    if ((int)cVar1 != xVar2) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x2a92,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    if (this->_rettype != '\x01') goto switchD_0024b4a1_caseD_10;
    this_00 = xpath_variable::get_node_set((this->_data).variable);
    xpath_node_set_raw::xpath_node_set_raw(__return_storage_ptr__);
    tVar3 = xpath_node_set::type(this_00);
    xpath_node_set_raw::set_type(__return_storage_ptr__,tVar3);
    begin__00 = xpath_node_set::begin(this_00);
    end__00 = xpath_node_set::end(this_00);
    xpath_node_set_raw::append(__return_storage_ptr__,begin__00,end__00,stack->result);
    break;
  case '\x18':
    xpath_node_set_raw::xpath_node_set_raw(__return_storage_ptr__);
    break;
  case '8':
    switch(this->_axis) {
    case '\0':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x01':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x02':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x03':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x04':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x05':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\x06':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\a':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\b':
      xpath_node_set_raw::xpath_node_set_raw(__return_storage_ptr__);
      break;
    case '\t':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\n':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\v':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    case '\f':
      step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                (__return_storage_ptr__,this,c,stack,eval);
      break;
    default:
      __assert_fail("false && \"Unknown axis\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x2a7d,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    break;
  case '9':
    if (this->_right != (xpath_ast_node *)0x0) {
      __assert_fail("!_right",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x2a84,
                    "xpath_node_set_raw pugi::impl::(anonymous namespace)::xpath_ast_node::eval_node_set(const xpath_context &, const xpath_stack &, nodeset_eval_t)"
                   );
    }
    xpath_node_set_raw::xpath_node_set_raw(__return_storage_ptr__);
    xpath_node_set_raw::set_type(__return_storage_ptr__,type_sorted);
    local_a0[0] = xpath_node::node(&c->n);
    p_Var4 = xml_node::operator_cast_to_function_pointer(local_a0);
    if (p_Var4 == (unspecified_bool_type)0x0) {
      local_c8 = xpath_node::attribute(&c->n);
      p_Var5 = xml_attribute::operator_cast_to_function_pointer(&local_c8);
      if (p_Var5 != (unspecified_bool_type)0x0) {
        s = (xpath_node_set *)xpath_node::parent(&c->n);
        local_e0 = xml_node::root((xml_node *)&s);
        xpath_node::xpath_node(&local_d8,&local_e0);
        xpath_node_set_raw::push_back(__return_storage_ptr__,&local_d8,stack->result);
      }
    }
    else {
      local_c0 = xpath_node::node(&c->n);
      local_b8 = xml_node::root(&local_c0);
      xpath_node::xpath_node(&local_b0,&local_b8);
      xpath_node_set_raw::push_back(__return_storage_ptr__,&local_b0,stack->result);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}
			}

			// fallthrough
			default:
				assert(false && "Wrong expression for return type node set"); // unreachable
				return xpath_node_set_raw();
			}
		}